

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecode.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_bytecodeInterpreter_functionApplyNoCopyArguments
          (sysbvm_context_t *context,sysbvm_tuple_t function,size_t argumentCount,
          sysbvm_tuple_t *arguments,sysbvm_bitflags_t applicationFlags)

{
  uint uVar1;
  sysbvm_tuple_t sVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  if ((applicationFlags & 3) != 0) goto LAB_0014230d;
  if ((function & 0xf) == 0 && function != 0) {
    uVar4 = *(ulong *)function;
    if (((uVar4 & 0xf) == 0 && uVar4 != 0) && ((*(byte *)(uVar4 + 8) & 0x80) == 0)) {
      uVar4 = *(ulong *)(uVar4 + 0x70);
      if (uVar4 == 0 || (uVar4 & 0xf) != 0) {
        uVar1 = (uint)((long)uVar4 >> 4);
      }
      else {
        uVar1 = (uint)*(undefined8 *)(uVar4 + 0x10);
      }
    }
    else {
      uVar1 = 0;
    }
    if ((uVar1 >> 0xc & 1) == 0) goto LAB_00142304;
    uVar4 = *(ulong *)(function + 0x28);
    if (uVar4 == 0 || (uVar4 & 0xf) != 0) {
      uVar4 = (long)uVar4 >> 4;
    }
    else {
      uVar4 = *(ulong *)(uVar4 + 0x10);
    }
  }
  else {
LAB_00142304:
    uVar4 = 0;
  }
  if ((uVar4 & 2) != 0) {
    sVar3 = sysbvm_function_getArgumentCount(context,function);
    if (sVar3 == 0) {
      sysbvm_error_assertionFailure
                (
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/bytecode.c:102: assertion failure: expectedArgumentCount > 0"
                );
    }
    uVar4 = sVar3 - 1;
    if (argumentCount < uVar4) {
      sysbvm_error("Missing required arguments.");
    }
    sVar2 = sysbvm_array_create(context,argumentCount - uVar4);
    lVar6 = argumentCount - uVar4;
    if (lVar6 != 0) {
      lVar5 = 0;
      do {
        *(sysbvm_tuple_t *)(sVar2 + 0x10 + lVar5 * 8) = arguments[uVar4 + lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar6 + (ulong)(lVar6 == 0) != lVar5);
    }
    arguments[sVar3 - 1] = sVar2;
    argumentCount = sVar3;
  }
LAB_0014230d:
  sVar2 = sysbvm_function_apply(context,function,argumentCount,arguments,applicationFlags);
  return sVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_bytecodeInterpreter_functionApplyNoCopyArguments(sysbvm_context_t *context, sysbvm_tuple_t function, size_t argumentCount, sysbvm_tuple_t *arguments, sysbvm_bitflags_t applicationFlags)
{
    if((applicationFlags & (SYSBVM_FUNCTION_APPLICATION_FLAGS_NO_TYPECHECK | SYSBVM_FUNCTION_APPLICATION_FLAGS_VARIADIC_EXPANDED)) == 0 &&
        sysbvm_function_isVariadic(context, function))
    {
        size_t expectedArgumentCount = sysbvm_function_getArgumentCount(context, function);
        SYSBVM_ASSERT(expectedArgumentCount > 0);

        // Move the variadic arguments into a variadic vector.
        {
            size_t directArgumentCount = expectedArgumentCount - 1;
            if(argumentCount < directArgumentCount)
                sysbvm_error("Missing required arguments.");

            size_t variadicArgumentCount = argumentCount - directArgumentCount;
            sysbvm_tuple_t variadicVector = sysbvm_array_create(context, variadicArgumentCount);
            sysbvm_tuple_t *variadicVectorElements = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(variadicVector)->pointers;
            for(size_t i = 0; i < variadicArgumentCount; ++i)
                variadicVectorElements[i] = arguments[directArgumentCount + i];
            arguments[directArgumentCount] = variadicVector;
        }

        return sysbvm_function_apply(context, function, expectedArgumentCount, arguments, applicationFlags);

    }
    return sysbvm_function_apply(context, function, argumentCount, arguments, applicationFlags);
}